

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall
Node::AddList(Node *this,string *name,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *attribute_list)

{
  pointer pbVar1;
  pointer pcVar2;
  Node *pNVar3;
  mapped_type *pmVar4;
  pointer pbVar5;
  shared_ptr<Node> list_node;
  string list_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  Node *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  shared_ptr<Node> local_c8;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  Node *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  key_type local_50;
  
  local_90[0] = (undefined1 *)CONCAT71(local_90[0]._1_7_,1);
  local_d8 = (Node *)0x0;
  local_98 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Node,std::allocator<Node>,std::__cxx11::string&,bool>
            (&local_d0,&local_d8,(allocator<Node> *)&local_b8,name,(bool *)local_90);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  pbVar5 = (attribute_list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (attribute_list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + pbVar5->_M_string_length);
      std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90[0]);
      std::__cxx11::string::append((char *)&local_b8);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  pNVar3 = local_d8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_b8,local_b8 + local_b0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pNVar3->_attributes,&local_50);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_c8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_c8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_d0._M_pi;
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
    }
  }
  AddChild(local_98,&local_c8);
  if (local_c8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
  }
  return;
}

Assistant:

void Node::AddList(std::string name, std::vector<std::string> attribute_list) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    std::string list_string = "";
    for(auto item: attribute_list) {
        list_string.append(item);
        list_string.append(";");
    }
    list_node->AddAttribute("List", list_string);
    this->AddChild(list_node);
}